

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O0

int adh_compress_file(char *input_file_name,char *output_file_name)

{
  size_t sVar1;
  int local_844;
  int i;
  size_t bytesRead;
  byte_t input_buffer [1024];
  byte_t output_buffer [1024];
  int local_2c;
  FILE *pFStack_28;
  int rc;
  FILE *input_file_ptr;
  FILE *output_file_ptr;
  char *output_file_name_local;
  char *input_file_name_local;
  
  output_file_ptr = (FILE *)output_file_name;
  output_file_name_local = input_file_name;
  log_info("adh_compress_file","%-40s %s\n",input_file_name,output_file_name);
  local_2c = adh_init(output_file_name_local,(char *)output_file_ptr,&input_file_ptr,
                      (FILE **)&stack0xffffffffffffffd8);
  if (local_2c == 0) {
    memset(input_buffer + 0x3f8,0,0x400);
    memset(&bytesRead,0,0x400);
    out_bit_idx = 3;
    is_first_byte = true;
    while (sVar1 = fread(&bytesRead,1,0x400,pFStack_28), sVar1 != 0) {
      for (local_844 = 0; (ulong)(long)local_844 < sVar1; local_844 = local_844 + 1) {
        local_2c = process_symbol(input_buffer[(long)local_844 + -8],input_buffer + 0x3f8,
                                  input_file_ptr);
        if (local_2c != 0) goto LAB_0010153d;
      }
    }
    local_2c = flush_data(input_buffer + 0x3f8,input_file_ptr);
    if (local_2c == 0) {
      print_final_stats((FILE *)pFStack_28,input_file_ptr);
      fclose((FILE *)input_file_ptr);
      input_file_ptr = bin_open_update((char *)output_file_ptr);
      if (input_file_ptr != (FILE *)0x0) {
        local_2c = flush_header(input_file_ptr);
      }
    }
  }
LAB_0010153d:
  adh_release(input_file_ptr,(FILE *)pFStack_28);
  return local_2c;
}

Assistant:

int adh_compress_file(const char input_file_name[], const char output_file_name[]) {
    log_info("adh_compress_file", "%-40s %s\n", input_file_name, output_file_name);

    FILE *output_file_ptr, *input_file_ptr;
    int rc = adh_init(input_file_name, output_file_name, &output_file_ptr, &input_file_ptr);
    if (rc != RC_OK) goto error_handling;

    byte_t output_buffer[BUFFER_SIZE] = {0};
    byte_t input_buffer[BUFFER_SIZE] = {0};

    // reserve first 3 bits for header
    out_bit_idx = HEADER_BITS;
    is_first_byte = true;

    size_t bytesRead = 0;
    while ((bytesRead = fread(input_buffer, sizeof(byte_t), BUFFER_SIZE, input_file_ptr)) > 0)
    {
        for(int i=0;i<bytesRead;i++) {
            rc = process_symbol(input_buffer[i], output_buffer, output_file_ptr);
            if (rc != RC_OK) goto error_handling;
        }
    }

    // flush remaining data to file
    rc = flush_data(output_buffer, output_file_ptr);
    if (rc != RC_OK) goto error_handling;

    print_final_stats(input_file_ptr, output_file_ptr);

    // close and reopen in update mode
    fclose(output_file_ptr);
    output_file_ptr = bin_open_update(output_file_name);
    if (output_file_ptr == NULL) goto error_handling;

    rc = flush_header(output_file_ptr);

error_handling:
    adh_release(output_file_ptr, input_file_ptr);

    return rc;
}